

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acknowledge_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Acknowledge_PDU::Acknowledge_PDU
          (Acknowledge_PDU *this,Remove_Entity_PDU *pdu,AcknowledgeResponseFlag ARF)

{
  KUINT32 KVar1;
  EntityIdentifier *OriginatingEntityID;
  EntityIdentifier *ReceivingEntityID;
  KUINT16 local_1c;
  AcknowledgeResponseFlag ARF_local;
  Remove_Entity_PDU *pdu_local;
  Acknowledge_PDU *this_local;
  
  OriginatingEntityID =
       Simulation_Management_Header::GetOriginatingEntityID((Simulation_Management_Header *)pdu);
  ReceivingEntityID =
       Simulation_Management_Header::GetReceivingEntityID((Simulation_Management_Header *)pdu);
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,OriginatingEntityID,ReceivingEntityID);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Acknowledge_PDU_00332920;
  this->m_ui16AcknowledgeFlag = 2;
  local_1c = (KUINT16)ARF;
  this->m_ui16ResponseFlag = local_1c;
  KVar1 = Create_Entity_PDU::GetRequestID(&pdu->super_Create_Entity_PDU);
  this->m_ui32RequestID = KVar1;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\x0f';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  return;
}

Assistant:

Acknowledge_PDU::Acknowledge_PDU( const Remove_Entity_PDU & pdu, AcknowledgeResponseFlag ARF ) :
    Simulation_Management_Header( pdu.GetOriginatingEntityID(), pdu.GetReceivingEntityID() ),
    m_ui16AcknowledgeFlag( RemoveEntityPDU ),
    m_ui16ResponseFlag( ARF ),
    m_ui32RequestID( pdu.GetRequestID() )
{
    m_ui8PDUType = Acknowledge_PDU_Type;
    m_ui16PDULength = ACKNOWLEDGE_PDU_SIZE;
}